

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_unres_check_disabled(lysc_node *node)

{
  bool bVar1;
  lysc_node_leaf **local_c0;
  lysc_node_leaf **local_a8;
  lysc_node_leaf **local_98;
  lysc_node_leaf *local_90;
  lysc_node_leaf *local_78;
  lysc_node_leaf *local_68;
  lysc_node_leaf *local_60;
  lysc_node_leaf **local_50;
  lysc_node_leaf *plStack_38;
  int found;
  uint64_t v;
  uint64_t u;
  lysc_node_list *slist;
  lysc_node *parent;
  lysc_node *node_local;
  
  if ((node->flags & 0x100) == 0) {
    for (slist = (lysc_node_list *)node->parent; slist != (lysc_node_list *)0x0;
        slist = (lysc_node_list *)(slist->field_0).node.parent) {
      if ((slist->field_0).node.nodetype == 0x10) {
        bVar1 = false;
        v = 0;
        while( true ) {
          if (slist->uniques == (lysc_node_leaf ***)0x0) {
            local_50 = (lysc_node_leaf **)0x0;
          }
          else {
            local_50 = slist->uniques[-1];
          }
          if (local_50 <= v) break;
          plStack_38 = (lysc_node_leaf *)0x0;
          while( true ) {
            if (slist->uniques[v] == (lysc_node_leaf **)0x0) {
              local_60 = (lysc_node_leaf *)0x0;
            }
            else {
              local_60 = slist->uniques[v][-1];
            }
            if (local_60 <= plStack_38) goto LAB_00167373;
            if (slist->uniques[v][(long)plStack_38] == (lysc_node_leaf *)node) break;
            plStack_38 = (lysc_node_leaf *)((long)&plStack_38->field_0 + 1);
          }
          bVar1 = true;
LAB_00167373:
          if (bVar1) break;
          v = v + 1;
        }
        if (bVar1) {
          if (slist->uniques[v] == (lysc_node_leaf **)0x0) {
            local_68 = (lysc_node_leaf *)0x0;
          }
          else {
            local_68 = slist->uniques[v][-1];
          }
          if (local_68 < (lysc_node_leaf *)0x2) {
            if (slist->uniques[v] != (lysc_node_leaf **)0x0) {
              free(slist->uniques[v] + -1);
            }
            if (slist->uniques == (lysc_node_leaf ***)0x0) {
              local_98 = (lysc_node_leaf **)0x0;
            }
            else {
              local_98 = slist->uniques[-1];
            }
            if (local_98 < (lysc_node_leaf **)0x2) {
              if (slist->uniques != (lysc_node_leaf ***)0x0) {
                free(slist->uniques + -1);
              }
              slist->uniques = (lysc_node_leaf ***)0x0;
            }
            else {
              if (slist->uniques == (lysc_node_leaf ***)0x0) {
                local_a8 = (lysc_node_leaf **)0x0;
              }
              else {
                local_a8 = slist->uniques[-1];
              }
              if (v < (long)local_a8 - 1U) {
                if (slist->uniques == (lysc_node_leaf ***)0x0) {
                  local_c0 = (lysc_node_leaf **)0x0;
                }
                else {
                  local_c0 = slist->uniques[-1];
                }
                memmove(slist->uniques + v,slist->uniques + v + 1,((long)local_c0 + (-1 - v)) * 8);
              }
              slist->uniques[-1] = (lysc_node_leaf **)((long)slist->uniques[-1] + -1);
            }
          }
          else {
            if (slist->uniques[v] == (lysc_node_leaf **)0x0) {
              local_78 = (lysc_node_leaf *)0x0;
            }
            else {
              local_78 = slist->uniques[v][-1];
            }
            if (plStack_38 < (lysc_node_leaf *)((long)&local_78[-1].dflt + 7U)) {
              if (slist->uniques[v] == (lysc_node_leaf **)0x0) {
                local_90 = (lysc_node_leaf *)0x0;
              }
              else {
                local_90 = slist->uniques[v][-1];
              }
              memmove(slist->uniques[v] + (long)plStack_38,
                      slist->uniques[v] + (long)((long)&plStack_38->field_0 + 1),
                      ((long)local_90 + (-1 - (long)plStack_38)) * 8);
            }
            slist->uniques[v][-1] = (lysc_node_leaf *)((long)&slist->uniques[v][-1][-1].dflt + 7);
          }
        }
      }
    }
    node_local._4_4_ = LY_SUCCESS;
  }
  else {
    ly_log_location(node,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
    ly_vlog(node->module->ctx,(char *)0x0,LYVE_REFERENCE,"Key \"%s\" is disabled.",node->name);
    ly_log_location_revert(1,0,0,0);
    node_local._4_4_ = LY_EVALID;
  }
  return node_local._4_4_;
}

Assistant:

static LY_ERR
lys_compile_unres_check_disabled(const struct lysc_node *node)
{
    const struct lysc_node *parent;
    struct lysc_node_list *slist;
    LY_ARRAY_COUNT_TYPE u, v;
    int found;

    if (node->flags & LYS_KEY) {
        LOG_LOCSET(node, NULL);
        LOGVAL(node->module->ctx, LYVE_REFERENCE, "Key \"%s\" is disabled.", node->name);
        LOG_LOCBACK(1, 0);
        return LY_EVALID;
    }

    for (parent = node->parent; parent; parent = parent->parent) {
        if (parent->nodetype != LYS_LIST) {
            continue;
        }

        /* check and fix list uniques */
        slist = (struct lysc_node_list *)parent;
        found = 0;
        LY_ARRAY_FOR(slist->uniques, u) {
            LY_ARRAY_FOR(slist->uniques[u], v) {
                if (slist->uniques[u][v] == (struct lysc_node_leaf *)node) {
                    found = 1;
                    break;
                }
            }

            if (found) {
                break;
            }
        }

        if (found) {
            if (LY_ARRAY_COUNT(slist->uniques[u]) > 1) {
                /* remove the item */
                if (v < LY_ARRAY_COUNT(slist->uniques[u]) - 1) {
                    memmove(&slist->uniques[u][v], &slist->uniques[u][v + 1],
                            (LY_ARRAY_COUNT(slist->uniques[u]) - v - 1) * sizeof slist->uniques[u][v]);
                }
                LY_ARRAY_DECREMENT(slist->uniques[u]);
            } else {
                /* remove the whole unique array */
                LY_ARRAY_FREE(slist->uniques[u]);
                if (LY_ARRAY_COUNT(slist->uniques) > 1) {
                    if (u < LY_ARRAY_COUNT(slist->uniques) - 1) {
                        memmove(&slist->uniques[u], &slist->uniques[u + 1],
                                (LY_ARRAY_COUNT(slist->uniques) - u - 1) * sizeof slist->uniques[u]);
                    }
                    LY_ARRAY_DECREMENT(slist->uniques);
                } else {
                    LY_ARRAY_FREE(slist->uniques);
                    slist->uniques = NULL;
                }
            }
        }
    }

    return LY_SUCCESS;
}